

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearGE<0,_0>::propagate(LinearGE<0,_0> *this)

{
  Lit *pLVar1;
  int iVar2;
  ulong uVar3;
  Clause *pCVar4;
  IntView<0> *pIVar5;
  ulong uVar6;
  uint uVar7;
  IntView<1> *pIVar8;
  IntVar *pIVar9;
  ulong uVar10;
  long lVar11;
  uint j;
  int64_t iVar12;
  long lVar13;
  bool bVar14;
  
  iVar12 = this->fix_sum;
  uVar3 = (ulong)(this->x).sz;
  uVar10 = (ulong)(uint)this->fix_x;
  pIVar5 = (this->x).data + uVar10;
  for (uVar6 = uVar10; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    iVar12 = iVar12 + (pIVar5->var->max).v;
    pIVar5 = pIVar5 + 1;
  }
  uVar6 = (ulong)(uint)this->fix_y;
  pIVar8 = (this->y).data + uVar6;
  for (; uVar6 < (this->y).sz; uVar6 = uVar6 + 1) {
    iVar12 = iVar12 - (pIVar8->var->min).v;
    pIVar8 = pIVar8 + 1;
  }
  for (; (uint)uVar10 < (uint)uVar3; uVar10 = (ulong)((uint)uVar10 + 1)) {
    pIVar9 = (this->x).data[uVar10].var;
    lVar13 = (pIVar9->max).v - iVar12;
    if ((pIVar9->min).v < lVar13) {
      if (so.lazy == true) {
        lVar11 = 0;
        for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
          iVar2 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar11) + 0x48))();
          (this->ps).data[uVar6].x = iVar2;
          uVar3 = (ulong)(this->x).sz;
          lVar11 = lVar11 + 0x10;
        }
        lVar11 = 0;
        for (uVar6 = 0; uVar6 < (this->y).sz; uVar6 = uVar6 + 1) {
          iVar2 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar11) + 0x40))();
          (this->ps).data[(this->x).sz + (int)uVar6].x = iVar2;
          lVar11 = lVar11 + 0x10;
        }
        pLVar1 = (this->ps).data;
        pLVar1[uVar10].x = pLVar1->x;
        pCVar4 = Reason_new<vec<Lit>>(&this->ps);
        pIVar9 = (this->x).data[uVar10].var;
      }
      else {
        pCVar4 = (Clause *)0x0;
      }
      iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])(pIVar9,lVar13,pCVar4,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
      uVar3 = (ulong)(this->x).sz;
    }
  }
  uVar7 = this->fix_y;
  do {
    bVar14 = (this->y).sz <= uVar7;
    if (bVar14) {
      return true;
    }
    pIVar9 = (this->y).data[uVar7].var;
    lVar11 = (pIVar9->min).v + iVar12;
    lVar13 = (long)(pIVar9->max).v;
    if (lVar13 != lVar11 && SBORROW8(-lVar11,-lVar13) == -lVar11 + lVar13 < 0) {
      if (so.lazy == true) {
        lVar13 = 0;
        for (uVar6 = 0; uVar6 < (this->x).sz; uVar6 = uVar6 + 1) {
          iVar2 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar13) + 0x48))();
          (this->ps).data[uVar6].x = iVar2;
          lVar13 = lVar13 + 0x10;
        }
        lVar13 = 0;
        for (uVar6 = 0; uVar6 < (this->y).sz; uVar6 = uVar6 + 1) {
          iVar2 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar13) + 0x40))();
          (this->ps).data[(this->x).sz + (int)uVar6].x = iVar2;
          lVar13 = lVar13 + 0x10;
        }
        pLVar1 = (this->ps).data;
        pLVar1[(this->x).sz + uVar7].x = pLVar1->x;
        pCVar4 = Reason_new<vec<Lit>>(&this->ps);
        pIVar9 = (this->y).data[uVar7].var;
      }
      else {
        pCVar4 = (Clause *)0x0;
      }
      iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])(pIVar9,lVar11,pCVar4,1);
      if ((char)iVar2 == '\0') {
        return bVar14;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}